

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp,opj_event_mgr_t *p_manager)

{
  opj_ppx *poVar1;
  long lVar2;
  opj_cp_t *poVar3;
  ulong uVar4;
  ulong uVar5;
  char *fmt;
  uint uVar6;
  uint uVar7;
  OPJ_BOOL OVar8;
  OPJ_BYTE *pOVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  OPJ_UINT32 l_N_ppm_1;
  OPJ_UINT32 l_N_ppm;
  uint local_54;
  opj_event_mgr_t *local_50;
  opj_cp_t *local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_50 = p_manager;
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf10,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
  }
  if (p_cp->ppm_buffer != (OPJ_BYTE *)0x0) {
    __assert_fail("p_cp->ppm_buffer == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf12,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
  }
  OVar8 = 1;
  if ((p_cp->field_0x90 & 1) != 0) {
    local_48 = p_cp;
    if (p_cp->ppm_markers_count == 0) {
      bVar16 = true;
      uVar6 = 0;
    }
    else {
      uVar14 = 0;
      uVar10 = 0;
      uVar11 = 0;
      uVar6 = 0;
      do {
        pOVar9 = p_cp->ppm_markers[uVar10].m_data;
        if (pOVar9 != (OPJ_BYTE *)0x0) {
          uVar13 = p_cp->ppm_markers[uVar10].m_data_size;
          bVar16 = true;
          uVar7 = uVar11 - uVar13;
          if (uVar11 < uVar13) {
            pOVar9 = pOVar9 + uVar11;
            uVar5 = (ulong)(uVar13 - uVar11);
            uVar15 = uVar14;
            if (uVar13 < uVar11) {
              uVar5 = uVar14;
            }
            do {
              if ((uint)uVar5 < 4) {
                opj_event_msg(local_50,1,"Not enough bytes to read Nppm\n");
                bVar16 = false;
                uVar7 = (uint)uVar15;
                goto LAB_001151fc;
              }
              opj_read_bytes_LE(pOVar9,&local_3c,4);
              uVar11 = (uint)uVar5 - 4;
              uVar6 = uVar6 + local_3c;
              uVar5 = (ulong)(uVar11 - local_3c);
              if (uVar11 < local_3c) {
                uVar5 = uVar14;
              }
              bVar16 = local_3c < uVar11;
              uVar11 = local_3c - uVar11;
              if (!bVar16 && uVar11 != 0) {
                uVar15 = (ulong)uVar11;
              }
              uVar4 = (ulong)local_3c;
              if (!bVar16 && uVar11 != 0) {
                uVar4 = uVar14;
              }
              pOVar9 = pOVar9 + uVar4 + 4;
            } while (bVar16);
            bVar16 = true;
            uVar7 = (uint)uVar15;
          }
LAB_001151fc:
          uVar11 = uVar7;
          p_cp = local_48;
          if (!bVar16) {
            return 0;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < p_cp->ppm_markers_count);
      bVar16 = uVar11 == 0;
    }
    if (bVar16) {
      pOVar9 = (OPJ_BYTE *)opj_malloc((ulong)uVar6);
      p_cp->ppm_buffer = pOVar9;
      if (pOVar9 != (OPJ_BYTE *)0x0) {
        p_cp->ppm_len = uVar6;
        if (p_cp->ppm_markers_count != 0) {
          uVar10 = 0;
          uVar11 = 0;
          uVar6 = 0;
          do {
            pOVar9 = p_cp->ppm_markers[uVar10].m_data;
            if (pOVar9 != (OPJ_BYTE *)0x0) {
              uVar13 = p_cp->ppm_markers[uVar10].m_data_size;
              uVar7 = uVar11 - uVar13;
              local_40 = uVar6;
              local_38 = uVar10 * 0x10;
              if (uVar11 < uVar13) {
                memcpy(p_cp->ppm_buffer + uVar6,pOVar9,(ulong)uVar11);
                pOVar9 = pOVar9 + uVar11;
                uVar12 = uVar13 - uVar11;
                uVar7 = 0;
                uVar13 = uVar11;
              }
              else {
                memcpy(p_cp->ppm_buffer + uVar6,pOVar9,(ulong)uVar13);
                uVar12 = 0;
              }
              poVar3 = local_48;
              uVar6 = uVar13 + local_40;
              uVar11 = uVar7;
              lVar2 = local_38;
              while (local_38 = lVar2, uVar12 != 0) {
                if (uVar12 < 4) {
                  bVar16 = false;
                  opj_event_msg(local_50,1,"Not enough bytes to read Nppm\n");
                  goto LAB_0011537c;
                }
                opj_read_bytes_LE(pOVar9,&local_54,4);
                pOVar9 = pOVar9 + 4;
                uVar13 = uVar12 - 4;
                if (uVar13 < local_54) {
                  memcpy(poVar3->ppm_buffer + uVar6,pOVar9,(ulong)uVar13);
                  uVar11 = local_54 - uVar13;
                  uVar12 = 0;
                }
                else {
                  memcpy(poVar3->ppm_buffer + uVar6,pOVar9,(ulong)local_54);
                  uVar12 = uVar13 - local_54;
                  pOVar9 = pOVar9 + local_54;
                  uVar13 = local_54;
                }
                uVar6 = uVar6 + uVar13;
                lVar2 = local_38;
              }
              opj_free(*(void **)((long)&poVar3->ppm_markers->m_data + lVar2));
              poVar1 = poVar3->ppm_markers;
              *(undefined8 *)((long)&poVar1->m_data + lVar2) = 0;
              *(undefined4 *)((long)&poVar1->m_data_size + lVar2) = 0;
              bVar16 = true;
LAB_0011537c:
              if (!bVar16) {
                return 0;
              }
            }
            uVar10 = uVar10 + 1;
            p_cp = local_48;
          } while (uVar10 < local_48->ppm_markers_count);
        }
        p_cp->ppm_data = p_cp->ppm_buffer;
        p_cp->ppm_data_size = p_cp->ppm_len;
        p_cp->ppm_markers_count = 0;
        opj_free(p_cp->ppm_markers);
        p_cp->ppm_markers = (opj_ppx *)0x0;
        return 1;
      }
      fmt = "Not enough memory to read PPM marker\n";
    }
    else {
      fmt = "Corrupted PPM markers\n";
    }
    OVar8 = 0;
    opj_event_msg(local_50,1,fmt);
  }
  return OVar8;
}

Assistant:

static OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp, opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, l_ppm_data_size, l_N_ppm_remaining;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_manager != 00);
    assert(p_cp->ppm_buffer == NULL);

    if (p_cp->ppm == 0U) {
        return OPJ_TRUE;
    }

    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;
                    l_ppm_data_size +=
                        l_N_ppm; /* can't overflow, max 256 markers of max 65536 bytes, that is when PPM markers are not corrupted which is checked elsewhere */

                    if (l_data_size >= l_N_ppm) {
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
        }
    }

    if (l_N_ppm_remaining != 0U) {
        /* clean up to be done on l_cp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Corrupted PPM markers\n");
        return OPJ_FALSE;
    }

    p_cp->ppm_buffer = (OPJ_BYTE *) opj_malloc(l_ppm_data_size);
    if (p_cp->ppm_buffer == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
        return OPJ_FALSE;
    }
    p_cp->ppm_len = l_ppm_data_size;
    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                l_ppm_data_size += l_data_size;
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm_remaining);
                l_ppm_data_size += l_N_ppm_remaining;
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;

                    if (l_data_size >= l_N_ppm) {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm);
                        l_ppm_data_size += l_N_ppm;
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                        l_ppm_data_size += l_data_size;
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
            opj_free(p_cp->ppm_markers[i].m_data);
            p_cp->ppm_markers[i].m_data = NULL;
            p_cp->ppm_markers[i].m_data_size = 0U;
        }
    }

    p_cp->ppm_data = p_cp->ppm_buffer;
    p_cp->ppm_data_size = p_cp->ppm_len;

    p_cp->ppm_markers_count = 0U;
    opj_free(p_cp->ppm_markers);
    p_cp->ppm_markers = NULL;

    return OPJ_TRUE;
}